

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall
boost::runtime::enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0>::
value_help(enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *this,
          ostream *ostr)

{
  size_type sVar1;
  pointer pbVar2;
  iterator pvVar3;
  iterator pvVar4;
  bool bVar5;
  pointer pbVar6;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  sVar1 = (this->
          super_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>).
          super_basic_param.p_value_hint._M_string_length;
  if (sVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,(this->
                    super_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>
                    ).super_basic_param.p_value_hint._M_dataplus._M_p,sVar1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"<",1);
  pbVar6 = (this->m_valid_names).
           super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_valid_names).
           super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar2) {
    bVar5 = true;
    do {
      pvVar3 = pbVar6->m_begin;
      pvVar4 = pbVar6->m_end;
      if (!bVar5) {
        local_50 = (long *)CONCAT71(local_50._1_7_,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)&local_50,1);
      }
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pvVar3,pvVar4);
      std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      pbVar6 = pbVar6 + 1;
      bVar5 = false;
    } while (pbVar6 != pbVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr,">",1);
  return;
}

Assistant:

virtual void    value_help( std::ostream& ostr ) const
    {
        if( this->p_value_hint.empty() ) {
            ostr << "<";
            bool first = true;
            BOOST_TEST_FOREACH( cstring, name, m_valid_names ) {
                if( first )
                    first = false;
                else
                    ostr << '|';
                ostr << name;
            }
            ostr << ">";
        }
        else
            ostr << this->p_value_hint;
    }